

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fakebl.c
# Opt level: O0

int setup_dir(void)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  FILE *__stream;
  FILE *mbrf;
  int r;
  
  uVar1 = mkdir(path,0x1ed);
  sVar3 = strlen(path);
  brpath = (char *)malloc(sVar3 + 0xc);
  sVar3 = strlen(path);
  mbrpath = (char *)malloc(sVar3 + 0x10);
  strcpy(brpath,path);
  strcpy(mbrpath,path);
  strcat(brpath,"/brightness");
  strcat(mbrpath,"/max_brightness");
  uVar2 = mkfifo(brpath,0x1b6);
  __stream = fopen(mbrpath,"w");
  if (__stream != (FILE *)0x0) {
    fputs("100\n",__stream);
  }
  fclose(__stream);
  return (uint)(__stream == (FILE *)0x0) | uVar2 | uVar1;
}

Assistant:

int setup_dir()
{
	int r=mkdir(path,0755);
	brpath=malloc(strlen(path)+12);
	mbrpath=malloc(strlen(path)+16);
	strcpy(brpath,path);
	strcpy(mbrpath,path);
	strcat(brpath,"/brightness");
	strcat(mbrpath,"/max_brightness");
	r|=mkfifo(brpath,0666);
	FILE* mbrf=fopen(mbrpath,"w");
	r|=(mbrf==NULL);
	if(mbrf)fputs("100\n",mbrf);
	fclose(mbrf);
	return r;
}